

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBColsUp2_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  uint32_t uVar1;
  int j;
  uint32_t *dst;
  uint32_t *src;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  dst = (uint32_t *)dst_argb;
  src = (uint32_t *)src_argb;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    uVar1 = *src;
    *dst = uVar1;
    dst[1] = uVar1;
    src = src + 1;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *src;
  }
  return;
}

Assistant:

void ScaleARGBColsUp2_C(uint8_t* dst_argb,
                        const uint8_t* src_argb,
                        int dst_width,
                        int x,
                        int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[1] = dst[0] = src[0];
    src += 1;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}